

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCorrFunc.hpp
# Opt level: O3

void __thiscall
OpenMD::TimeCorrFunc<OpenMD::DynamicVector<double,_std::allocator<double>_>_>::~TimeCorrFunc
          (TimeCorrFunc<OpenMD::DynamicVector<double,_std::allocator<double>_>_> *this)

{
  DumpReader *this_00;
  ProgressBar *pPVar1;
  pointer pcVar2;
  pointer pdVar3;
  pointer piVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  
  (this->super_DynamicProperty)._vptr_DynamicProperty = (_func_int **)&PTR__TimeCorrFunc_002f0dd0;
  this_00 = this->reader_;
  if (this_00 != (DumpReader *)0x0) {
    DumpReader::~DumpReader(this_00);
  }
  operator_delete(this_00,0x1258);
  pPVar1 = (this->progressBar_)._M_t.
           super___uniq_ptr_impl<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>.
           _M_t.
           super__Tuple_impl<0UL,_OpenMD::ProgressBar_*,_std::default_delete<OpenMD::ProgressBar>_>.
           super__Head_base<0UL,_OpenMD::ProgressBar_*,_false>._M_head_impl;
  if (pPVar1 != (ProgressBar *)0x0) {
    operator_delete(pPVar1,0x20);
  }
  (this->progressBar_)._M_t.
  super___uniq_ptr_impl<OpenMD::ProgressBar,_std::default_delete<OpenMD::ProgressBar>_>._M_t.
  super__Tuple_impl<0UL,_OpenMD::ProgressBar_*,_std::default_delete<OpenMD::ProgressBar>_>.
  super__Head_base<0UL,_OpenMD::ProgressBar_*,_false>._M_head_impl = (ProgressBar *)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&this->selection2StartFrame_);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&this->selection1StartFrame_);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&this->GIDtoSele2_);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&this->GIDtoSele1_);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&this->sele2ToIndex_);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&this->sele1ToIndex_);
  pcVar2 = (this->labelString_)._M_dataplus._M_p;
  paVar5 = &(this->labelString_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar5) {
    operator_delete(pcVar2,paVar5->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->paramString_)._M_dataplus._M_p;
  paVar5 = &(this->paramString_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar5) {
    operator_delete(pcVar2,paVar5->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->corrFuncType_)._M_dataplus._M_p;
  paVar5 = &(this->corrFuncType_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar5) {
    operator_delete(pcVar2,paVar5->_M_allocated_capacity + 1);
  }
  SelectionEvaluator::~SelectionEvaluator(&this->evaluator2_);
  SelectionEvaluator::~SelectionEvaluator(&this->evaluator1_);
  pcVar2 = (this->selectionScript2_)._M_dataplus._M_p;
  paVar5 = &(this->selectionScript2_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar5) {
    operator_delete(pcVar2,paVar5->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->selectionScript1_)._M_dataplus._M_p;
  paVar5 = &(this->selectionScript1_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar5) {
    operator_delete(pcVar2,paVar5->_M_allocated_capacity + 1);
  }
  SelectionManager::~SelectionManager(&this->seleMan2_);
  SelectionManager::~SelectionManager(&this->seleMan1_);
  pcVar2 = (this->dumpFilename_)._M_dataplus._M_p;
  paVar5 = &(this->dumpFilename_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar5) {
    operator_delete(pcVar2,paVar5->_M_allocated_capacity + 1);
  }
  pdVar3 = (this->times_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar3 != (pointer)0x0) {
    operator_delete(pdVar3,(long)(this->times_).super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pdVar3);
  }
  piVar4 = (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar4 != (pointer)0x0) {
    operator_delete(piVar4,(long)(this->count_).super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)piVar4);
  }
  std::
  vector<OpenMD::DynamicVector<double,_std::allocator<double>_>,_std::allocator<OpenMD::DynamicVector<double,_std::allocator<double>_>_>_>
  ::~vector(&this->histogram_);
  (this->super_DynamicProperty)._vptr_DynamicProperty = (_func_int **)&PTR__DynamicProperty_002eec50
  ;
  pcVar2 = (this->super_DynamicProperty).outputFilename_._M_dataplus._M_p;
  paVar5 = &(this->super_DynamicProperty).outputFilename_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar5) {
    operator_delete(pcVar2,paVar5->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~TimeCorrFunc() { delete reader_; }